

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O2

void AM_rotatePoint(double *x,double *y)

{
  AActor *pAVar1;
  double dVar2;
  double dVar3;
  DAngle local_18;
  
  dVar3 = m_w * 0.5 + m_x;
  dVar2 = m_h * 0.5 + m_y;
  *x = *x - dVar3;
  *y = *y - dVar2;
  pAVar1 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
  local_18.Degrees = 90.0 - (pAVar1->Angles).Yaw.Degrees;
  AM_rotate(x,y,&local_18);
  *x = dVar3 + *x;
  *y = dVar2 + *y;
  return;
}

Assistant:

void AM_rotatePoint (double *x, double *y)
{
	double pivotx = m_x + m_w/2;
	double pivoty = m_y + m_h/2;
	*x -= pivotx;
	*y -= pivoty;
	AM_rotate (x, y, -players[consoleplayer].camera->Angles.Yaw + 90.);
	*x += pivotx;
	*y += pivoty;
}